

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

unsigned_long_long
anon_unknown.dwarf_b837c::ParseLong(ExpressionContext *ctx,SynBase *source,char *s,char *e,int base)

{
  uint uVar1;
  char *msg;
  char *p;
  char *pos;
  char *pcVar2;
  uint uVar3;
  bool bVar4;
  
  pos = s;
  pcVar2 = (char *)0x0;
  do {
    if (e <= pos) {
      return (unsigned_long_long)pcVar2;
    }
    uVar1 = (int)*pos - 0x30;
    uVar3 = uVar1 & 0xff;
    if (9 < (byte)uVar1) {
      uVar3 = ((int)*pos & 0xffffffdfU) - 0x37;
    }
    if ((int)uVar3 < 0 || base <= (int)uVar3) {
      ReportAt(ctx,source,pos,"ERROR: digit %d is not allowed in base %d",(ulong)uVar3,base);
    }
    msg = (char *)((long)(int)uVar3 + (long)pcVar2 * (ulong)(uint)base);
    pos = pos + 1;
    bVar4 = pcVar2 <= msg;
    pcVar2 = msg;
  } while (bVar4);
  StopAt(ctx,source,s,msg);
  return (unsigned_long_long)msg;
}

Assistant:

unsigned long long ParseLong(ExpressionContext &ctx, SynBase *source, const char* s, const char* e, int base)
	{
		unsigned long long res = 0;

		for(const char *p = s; p < e; p++)
		{
			int digit = ((*p >= '0' && *p <= '9') ? *p - '0' : (*p & ~0x20) - 'A' + 10);

			if(digit < 0 || digit >= base)
				ReportAt(ctx, source, p, "ERROR: digit %d is not allowed in base %d", digit, base);

			unsigned long long prev = res;

			res = res * base + digit;

			if(res < prev)
				StopAt(ctx, source, s, "ERROR: overflow in integer constant");
		}

		return res;
	}